

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

void av1_pick_uniform_tx_size_type_yrd
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,BLOCK_SIZE bs,int64_t ref_best_rd)

{
  byte bVar1;
  _Bool _Var2;
  byte bVar3;
  _Bool _Var4;
  MB_MODE_INFO *pMVar5;
  MB_MODE_INFO *pMVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  undefined8 uVar9;
  int64_t iVar10;
  int64_t iVar11;
  undefined7 uVar12;
  uint32_t uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int (*paiVar17) [2];
  long lVar18;
  TX_SIZE TVar19;
  bool bVar20;
  int iVar21;
  TX_SIZE *pTVar22;
  ulong uVar23;
  byte bVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  int64_t iVar34;
  byte bVar35;
  byte bVar36;
  MB_RD_RECORD *pMVar37;
  MB_RD_INFO *pMVar38;
  byte bVar39;
  byte local_91d;
  MB_MODE_INFO *mbmi;
  long local_8d0;
  RD_STATS local_8b0;
  int64_t rd [3];
  int64_t dist;
  uint8_t best_blk_skip [1024];
  uint8_t best_txk_type_map [1024];
  
  pMVar5 = *(x->e_mbd).mi;
  bVar20 = true;
  if ((pMVar5->field_0xa7 & 0x80) == 0) {
    bVar20 = '\0' < pMVar5->ref_frame[0];
  }
  iVar15 = (x->e_mbd).mi_row;
  iVar21 = (x->e_mbd).mi_col;
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  iVar31 = 1 << ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[bs] - 4 & 0x1f);
  if (bVar20) {
    if (((((cpi->sf).rd_sf.use_mb_rd_hash == 0) || (iVar15 < (x->e_mbd).tile.mi_row_start)) ||
        ((x->e_mbd).tile.mi_row_end <=
         (int)(iVar15 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [bs]))) ||
       ((iVar21 < (x->e_mbd).tile.mi_col_start ||
        ((x->e_mbd).tile.mi_col_end <=
         (int)(iVar21 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [bs]))))) {
      pMVar37 = (MB_RD_RECORD *)0x0;
      uVar13 = 0;
    }
    else {
      uVar13 = (*av1_get_crc32c_value)
                         (&((x->txfm_search_info).mb_rd_record)->crc_calculator,
                          (uint8_t *)x->plane[0].src_diff,
                          (ulong)block_size_wide[bs] * (ulong)block_size_high[bs] * 2);
      uVar13 = uVar13 * 0x20 + (uint)bs;
      pMVar37 = (x->txfm_search_info).mb_rd_record;
      if ((ref_best_rd != 0x7fffffffffffffff) && (iVar15 = pMVar37->num, 0 < iVar15)) {
        iVar21 = pMVar37->index_start;
        do {
          iVar25 = iVar21 % 8;
          if (pMVar37->mb_rd_info[iVar25].hash_value == uVar13) {
            if (iVar25 != -1) {
              pMVar5 = *(x->e_mbd).mi;
              pMVar38 = pMVar37->mb_rd_info + iVar25;
              pMVar5->tx_size = pMVar38->tx_size;
              memcpy((x->txfm_search_info).blk_skip,pMVar38->blk_skip,(long)iVar31);
              uVar9 = *(undefined8 *)(pMVar38->inter_tx_size + 8);
              *(undefined8 *)pMVar5->inter_tx_size = *(undefined8 *)pMVar38->inter_tx_size;
              *(undefined8 *)(pMVar5->inter_tx_size + 8) = uVar9;
              memcpy((x->e_mbd).tx_type_map,pMVar37->mb_rd_info[iVar25].tx_type_map,(long)iVar31);
              iVar15 = pMVar37->mb_rd_info[iVar25].rd_stats.zero_rate;
              iVar34 = pMVar37->mb_rd_info[iVar25].rd_stats.dist;
              iVar10 = pMVar37->mb_rd_info[iVar25].rd_stats.rdcost;
              iVar11 = pMVar37->mb_rd_info[iVar25].rd_stats.sse;
              rd_stats->rate = pMVar37->mb_rd_info[iVar25].rd_stats.rate;
              rd_stats->zero_rate = iVar15;
              rd_stats->dist = iVar34;
              rd_stats->rdcost = iVar10;
              rd_stats->sse = iVar11;
              uVar12 = *(undefined7 *)&pMVar37->mb_rd_info[iVar25].rd_stats.field_0x21;
              rd_stats->skip_txfm = pMVar37->mb_rd_info[iVar25].rd_stats.skip_txfm;
              *(undefined7 *)&rd_stats->field_0x21 = uVar12;
              return;
            }
            break;
          }
          iVar21 = iVar21 + 1;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
    }
    if ((((x->txfm_search_params).skip_txfm_level != 0) &&
        ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0)) &&
       (iVar15 = predict_skip_txfm(x,bs,&dist,(uint)(cpi->common).features.reduced_tx_set_used),
       iVar15 != 0)) {
      set_skip_txfm(x,rd_stats,bs,dist);
      goto LAB_00237f69;
    }
  }
  else {
    uVar13 = 0;
    pMVar37 = (MB_RD_RECORD *)0x0;
  }
  if ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0) {
    if ((x->txfm_search_params).tx_size_search_method != '\x02') {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
      pMVar5 = *(x->e_mbd).mi;
      bVar1 = ""[bs];
      uVar16 = (ulong)bVar1;
      uVar23 = (ulong)(x->txfm_search_params).tx_mode_search_type;
      local_91d = bVar1;
      if (uVar23 == 2) {
        if ((pMVar5->field_0xa7 & 0x80) == 0) {
          bVar20 = pMVar5->ref_frame[0] < '\x01';
        }
        else {
          bVar20 = false;
        }
        if ((((byte)(bs - BLOCK_64X128) < 3) && ((cpi->sf).tx_sf.tx_size_search_lgr_block != 0)) ||
           (iVar15 = *(int *)((long)&((TX_SPEED_FEATURES *)(&(cpi->sf).intra_sf + 1))->
                                     inter_tx_size_search_init_depth_sqr +
                             (ulong)((uint)bVar20 * 8 +
                                    (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                           [bs] != 
                                                  "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                                  [bs]) * 4)), iVar15 == 2)) {
          uVar23 = (ulong)bVar1;
          if (((cpi->oxcf).txfm_cfg.enable_tx64 == false) &&
             (uVar23 = (ulong)bVar1, (0x61810UL >> (uVar16 & 0x3f) & 1) != 0)) {
            uVar23 = (ulong)""[uVar16];
          }
          goto LAB_00238091;
        }
        x->rd_model = '\0';
        rd[0] = 0x7fffffffffffffff;
        rd[1] = 0x7fffffffffffffff;
        rd[2] = 0x7fffffffffffffff;
        uVar23 = (ulong)bVar1;
        if (iVar15 < 3) goto LAB_002380bf;
      }
      else {
        bVar39 = ""[uVar23];
        uVar23 = (ulong)bVar39;
        if (bs == BLOCK_4X4) {
          if (""[bs] < bVar39) {
            uVar23 = (ulong)""[bs];
          }
        }
        else {
          bVar24 = bVar1;
          if (bVar39 < ""[uVar16]) {
            bVar24 = bVar39;
          }
          uVar23 = (ulong)bVar24;
        }
LAB_00238091:
        x->rd_model = '\0';
        iVar15 = 2;
LAB_002380bf:
        rd[1] = 0x7fffffffffffffff;
        rd[0] = 0x7fffffffffffffff;
        rd[2] = 0x7fffffffffffffff;
        iVar21 = (int)uVar23;
        local_8d0 = 0x7fffffffffffffff;
        lVar26 = (long)iVar15;
        do {
          iVar25 = (int)uVar23;
          if ((((cpi->oxcf).txfm_cfg.enable_tx64 != false) ||
              ((0x61810UL >> (uVar23 & 0x3f) & 1) == 0)) &&
             (((cpi->oxcf).txfm_cfg.enable_rect_tx != false ||
              (tx_size_wide[uVar23] == tx_size_high[uVar23])))) {
            if ((x->txfm_search_params).nn_prune_depths_for_intra_tx == '\x02') break;
            (x->txfm_search_params).enable_nn_prune_intra_tx_depths =
                 (_Bool)(iVar25 == iVar21 & (cpi->sf).tx_sf.prune_intra_tx_depths_using_nn);
            iVar34 = ref_best_rd;
            if (local_8d0 < ref_best_rd) {
              iVar34 = local_8d0;
            }
            if ((cpi->sf).tx_sf.use_rd_based_breakout_for_intra_tx_search == false) {
              iVar34 = ref_best_rd;
            }
            pMVar6 = *(x->e_mbd).mi;
            bVar20 = true;
            if ((pMVar6->field_0xa7 & 0x80) == 0) {
              bVar20 = '\0' < pMVar6->ref_frame[0];
            }
            bVar39 = (byte)uVar23;
            iVar32 = 0;
            if (((x->txfm_search_params).tx_mode_search_type == '\x02') &&
               (uVar16 = (ulong)pMVar6->bsize, iVar32 = 0, uVar16 != 0)) {
              bVar24 = *(x->e_mbd).above_txfm_context;
              bVar3 = *(x->e_mbd).left_txfm_context;
              uVar14 = (uint)bVar24;
              uVar28 = (uint)bVar3;
              if (iVar25 == 0) {
                lVar33 = 0;
              }
              else {
                bVar35 = block_size_high[uVar16];
                if (block_size_high[uVar16] < block_size_wide[uVar16]) {
                  bVar35 = block_size_wide[uVar16];
                }
                bVar36 = 1;
                uVar30 = 0x3f;
                if (bVar35 < 0x20) {
                  if (bVar35 == 8) {
                    TVar19 = '\x01';
                    bVar36 = 0;
                  }
                  else {
                    if (bVar35 != 0x10) goto LAB_002382e1;
                    TVar19 = '\x02';
                  }
LAB_002382b9:
                  uVar30 = (ulong)(byte)(((""[uVar23] != TVar19 & bVar36) + TVar19 * -2) * '\x03' +
                                        0x18);
                }
                else {
                  TVar19 = '\x04';
                  if ((bVar35 == 0x80) || (bVar35 == 0x40)) goto LAB_002382b9;
                  if (bVar35 == 0x20) {
                    TVar19 = '\x03';
                    goto LAB_002382b9;
                  }
                }
LAB_002382e1:
                lVar33 = (ulong)(uVar28 <= *(byte *)(tx_size_high + uVar23) &&
                                (uint)*(byte *)(tx_size_high + uVar23) != (uint)bVar3) +
                         (ulong)(uVar14 <= *(byte *)(tx_size_wide + uVar23) &&
                                (uint)*(byte *)(tx_size_wide + uVar23) != (uint)bVar24) + uVar30;
              }
              if (bVar20) {
                paiVar17 = (x->mode_costs).txfm_partition_cost + lVar33;
              }
              else {
                iVar32 = 0;
                if (bs == BLOCK_4X4) goto LAB_0023841f;
                lVar33 = 0;
                for (bVar24 = bVar1; bVar24 != bVar39; bVar24 = ""[bVar24]) {
                  lVar33 = lVar33 + 1;
                }
                _Var2 = (x->e_mbd).up_available;
                if ((_Var2 == true) &&
                   ((pMVar7 = (x->e_mbd).above_mbmi, (pMVar7->field_0xa7 & 0x80) != 0 ||
                    ('\0' < pMVar7->ref_frame[0])))) {
                  uVar14 = (uint)block_size_wide[pMVar7->bsize];
                }
                _Var4 = (x->e_mbd).left_available;
                if ((_Var4 != false) &&
                   ((pMVar7 = (x->e_mbd).left_mbmi, (pMVar7->field_0xa7 & 0x80) != 0 ||
                    ('\0' < pMVar7->ref_frame[0])))) {
                  uVar28 = (uint)block_size_high[pMVar7->bsize];
                }
                paiVar17 = (int (*) [2])
                           ((long)(x->mode_costs).skip_txfm_cost +
                           lVar33 * 4 +
                           (ulong)(byte)(_Var2 & tx_size_wide[""[uVar16]] <= (int)uVar14) * 0x14 +
                           (ulong)(byte)(_Var4 & tx_size_high[""[uVar16]] <= (int)uVar28) * 0x14 +
                           (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bs] * 0x3c
                           + -0x24);
              }
              iVar32 = (*paiVar17)[0];
            }
LAB_0023841f:
            pMVar7 = (x->e_mbd).left_mbmi;
            pMVar8 = (x->e_mbd).above_mbmi;
            if (pMVar8 == (MB_MODE_INFO *)0x0) {
              uVar28 = 0;
            }
            else {
              uVar28 = (uint)pMVar8->skip_txfm;
            }
            if (pMVar7 == (MB_MODE_INFO *)0x0) {
              uVar14 = 0;
            }
            else {
              uVar14 = (uint)pMVar7->skip_txfm;
            }
            lVar33 = (long)(x->mode_costs).skip_txfm_cost[uVar14 + uVar28][1];
            if (bVar20) {
              lVar27 = (long)x->rdmult;
              lVar18 = lVar27 * lVar33 + 0x100 >> 9;
            }
            else {
              lVar27 = (long)x->rdmult;
              lVar18 = 0x7fffffffffffffff;
            }
            iVar29 = (x->mode_costs).skip_txfm_cost[uVar14 + uVar28][0] + iVar32;
            lVar27 = iVar29 * lVar27 + 0x100 >> 9;
            pMVar6->tx_size = bVar39;
            if (lVar18 <= lVar27) {
              lVar27 = lVar18;
            }
            av1_txfm_rd_in_plane(x,cpi,&local_8b0,iVar34,lVar27,0,bs,bVar39,'\0',0);
            if (local_8b0.rate == 0x7fffffff) {
              lVar18 = 0x7fffffffffffffff;
              rd[lVar26] = 0x7fffffffffffffff;
            }
            else {
              if (local_8b0.skip_txfm == '\0' || !bVar20) {
                lVar18 = local_8b0.dist * 0x80 +
                         ((long)(iVar29 + local_8b0.rate) * (long)x->rdmult + 0x100 >> 9);
                local_8b0.rate = iVar32 + local_8b0.rate;
                if (((local_8b0.skip_txfm == '\0' && bVar20) &&
                    ((x->e_mbd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0)) &&
                   (lVar33 = local_8b0.sse * 0x80 + (x->rdmult * lVar33 + 0x100 >> 9),
                   lVar33 <= lVar18)) {
                  local_8b0.rate = 0;
                  local_8b0.dist = local_8b0.sse;
                  local_8b0.skip_txfm = '\x01';
                  lVar18 = lVar33;
                }
              }
              else {
                lVar18 = local_8b0.sse * 0x80 + (x->rdmult * lVar33 + 0x100 >> 9);
              }
              rd[lVar26] = lVar18;
              if (lVar18 < local_8d0) {
                memcpy(best_blk_skip,(x->txfm_search_info).blk_skip,(long)iVar31);
                memcpy(best_txk_type_map,(x->e_mbd).tx_type_map,(long)iVar31);
                rd_stats->rate = local_8b0.rate;
                rd_stats->zero_rate = local_8b0.zero_rate;
                rd_stats->dist = local_8b0.dist;
                rd_stats->rdcost = local_8b0.rdcost;
                rd_stats->sse = local_8b0.sse;
                *(ulong *)&rd_stats->skip_txfm = CONCAT71(local_8b0._33_7_,local_8b0.skip_txfm);
                local_91d = bVar39;
                local_8d0 = lVar18;
              }
            }
            if ((iVar25 == 0) ||
               (((lVar26 != 2 && iVar15 < lVar26 && (x->source_variance < 0x100)) &&
                (rd[lVar26 + -1] < lVar18)))) break;
          }
          lVar26 = lVar26 + 1;
          uVar23 = (ulong)""[uVar23];
        } while ((int)lVar26 != 3);
      }
      if (rd_stats->rate != 0x7fffffff) {
        pMVar5->tx_size = local_91d;
        memcpy((x->e_mbd).tx_type_map,best_txk_type_map,(long)iVar31);
        memcpy((x->txfm_search_info).blk_skip,best_blk_skip,(long)iVar31);
      }
      (x->txfm_search_params).nn_prune_depths_for_intra_tx = '\0';
      (x->txfm_search_params).enable_nn_prune_intra_tx_depths = false;
      goto LAB_00237f69;
    }
    pMVar5 = *(x->e_mbd).mi;
    bVar1 = ""[(x->txfm_search_params).tx_mode_search_type];
    if (bs == BLOCK_4X4) {
      uVar16 = (ulong)bVar1;
      if (""[bs] < bVar1) {
        uVar16 = (ulong)""[bs];
      }
    }
    else {
      uVar16 = (ulong)bVar1;
      if (""[""[bs]] <= bVar1) {
        uVar16 = (ulong)""[bs];
      }
    }
    TVar19 = (TX_SIZE)uVar16;
    pMVar5->tx_size = TVar19;
    _Var2 = (cpi->oxcf).txfm_cfg.enable_rect_tx;
    if ((cpi->oxcf).txfm_cfg.enable_tx64 == false) {
      if (_Var2 == false) {
        pTVar22 = choose_largest_tx_size_tx_size_max_32_square;
      }
      else {
        pTVar22 = choose_largest_tx_size_tx_size_max_32;
      }
LAB_00237eb9:
      TVar19 = pTVar22[uVar16];
      pMVar5->tx_size = TVar19;
    }
    else if (_Var2 == false) {
      pTVar22 = "";
      goto LAB_00237eb9;
    }
    pMVar6 = (x->e_mbd).left_mbmi;
    pMVar7 = (x->e_mbd).above_mbmi;
    if (pMVar7 == (MB_MODE_INFO *)0x0) {
      uVar28 = 0;
    }
    else {
      uVar28 = (uint)pMVar7->skip_txfm;
    }
    if (pMVar6 == (MB_MODE_INFO *)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = (uint)pMVar6->skip_txfm;
    }
    if (((pMVar5->field_0xa7 & 0x80) == 0) && (pMVar5->ref_frame[0] < '\x01')) {
      lVar26 = 0x7fffffffffffffff;
      lVar33 = (long)x->rdmult;
    }
    else {
      lVar33 = (long)x->rdmult;
      lVar26 = (x->mode_costs).skip_txfm_cost[uVar14 + uVar28][1] * lVar33 + 0x100 >> 9;
    }
    iVar34 = lVar33 * (x->mode_costs).skip_txfm_cost[uVar14 + uVar28][0] + 0x100 >> 9;
    if (lVar26 <= iVar34) {
      iVar34 = lVar26;
    }
  }
  else {
    (*(x->e_mbd).mi)->tx_size = '\0';
    TVar19 = '\0';
    iVar34 = 0;
  }
  av1_txfm_rd_in_plane(x,cpi,rd_stats,ref_best_rd,iVar34,0,bs,TVar19,'\0',0);
LAB_00237f69:
  if (pMVar37 != (MB_RD_RECORD *)0x0) {
    iVar15 = pMVar37->index_start;
    iVar21 = pMVar37->num;
    if (iVar21 < 8) {
      uVar14 = iVar15 + iVar21;
      uVar28 = iVar15 + iVar21 + 7;
      if (-1 < (int)uVar14) {
        uVar28 = uVar14;
      }
      iVar15 = uVar14 - (uVar28 & 0xfffffff8);
      pMVar37->num = iVar21 + 1;
    }
    else {
      uVar28 = iVar15 + 8;
      if (-1 < (int)(iVar15 + 1U)) {
        uVar28 = iVar15 + 1U;
      }
      pMVar37->index_start = (iVar15 - (uVar28 & 0xfffffff8)) + 1;
    }
    pMVar5 = *(x->e_mbd).mi;
    pMVar38 = pMVar37->mb_rd_info + iVar15;
    pMVar38->hash_value = uVar13;
    pMVar38->tx_size = pMVar5->tx_size;
    memcpy(pMVar38->blk_skip,(x->txfm_search_info).blk_skip,(long)iVar31);
    uVar9 = *(undefined8 *)(pMVar5->inter_tx_size + 8);
    *(undefined8 *)pMVar38->inter_tx_size = *(undefined8 *)pMVar5->inter_tx_size;
    *(undefined8 *)(pMVar38->inter_tx_size + 8) = uVar9;
    memcpy(pMVar37->mb_rd_info[iVar15].tx_type_map,(x->e_mbd).tx_type_map,(long)iVar31);
    iVar21 = rd_stats->zero_rate;
    iVar34 = rd_stats->dist;
    iVar10 = rd_stats->rdcost;
    iVar11 = rd_stats->sse;
    pMVar37->mb_rd_info[iVar15].rd_stats.rate = rd_stats->rate;
    pMVar37->mb_rd_info[iVar15].rd_stats.zero_rate = iVar21;
    pMVar37->mb_rd_info[iVar15].rd_stats.dist = iVar34;
    pMVar37->mb_rd_info[iVar15].rd_stats.rdcost = iVar10;
    pMVar37->mb_rd_info[iVar15].rd_stats.sse = iVar11;
    uVar12 = *(undefined7 *)&rd_stats->field_0x21;
    pMVar37->mb_rd_info[iVar15].rd_stats.skip_txfm = rd_stats->skip_txfm;
    *(undefined7 *)&pMVar37->mb_rd_info[iVar15].rd_stats.field_0x21 = uVar12;
  }
  return;
}

Assistant:

void av1_pick_uniform_tx_size_type_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                                       RD_STATS *rd_stats, BLOCK_SIZE bs,
                                       int64_t ref_best_rd) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *tx_params = &x->txfm_search_params;
  assert(bs == mbmi->bsize);
  const int is_inter = is_inter_block(mbmi);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  av1_init_rd_stats(rd_stats);

  // Hashing based speed feature for inter blocks. If the hash of the residue
  // block is found in the table, use previously saved search results and
  // terminate early.
  uint32_t hash = 0;
  MB_RD_RECORD *mb_rd_record = NULL;
  const int num_blks = bsize_to_num_blk(bs);
  if (is_inter && cpi->sf.rd_sf.use_mb_rd_hash) {
    const int within_border =
        mi_row >= xd->tile.mi_row_start &&
        (mi_row + mi_size_high[bs] < xd->tile.mi_row_end) &&
        mi_col >= xd->tile.mi_col_start &&
        (mi_col + mi_size_wide[bs] < xd->tile.mi_col_end);
    if (within_border) {
      hash = get_block_residue_hash(x, bs);
      mb_rd_record = x->txfm_search_info.mb_rd_record;
      const int match_index = find_mb_rd_info(mb_rd_record, ref_best_rd, hash);
      if (match_index != -1) {
        MB_RD_INFO *mb_rd_info = &mb_rd_record->mb_rd_info[match_index];
        fetch_mb_rd_info(num_blks, mb_rd_info, rd_stats, x);
        return;
      }
    }
  }

  // If we predict that skip is the optimal RD decision - set the respective
  // context and terminate early.
  int64_t dist;
  if (tx_params->skip_txfm_level && is_inter &&
      !xd->lossless[mbmi->segment_id] &&
      predict_skip_txfm(x, bs, &dist,
                        cpi->common.features.reduced_tx_set_used)) {
    // Populate rdstats as per skip decision
    set_skip_txfm(x, rd_stats, bs, dist);
    // Save the RD search results into mb_rd_record.
    if (mb_rd_record) {
      save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
    }
    return;
  }

  if (xd->lossless[mbmi->segment_id]) {
    // Lossless mode can only pick the smallest (4x4) transform size.
    choose_smallest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else if (tx_params->tx_size_search_method == USE_LARGESTALL) {
    choose_largest_tx_size(cpi, x, rd_stats, ref_best_rd, bs);
  } else {
    choose_tx_size_type_from_rd(cpi, x, rd_stats, ref_best_rd, bs);
  }

  // Save the RD search results into mb_rd_record for possible reuse in future.
  if (mb_rd_record) {
    save_mb_rd_info(num_blks, hash, x, rd_stats, mb_rd_record);
  }
}